

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O0

_Bool printAliasInstruction(MCInst *MI,SStream *O,MCRegisterInfo *MRI)

{
  _Bool _Var1;
  uint OpNo;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  SStream *op_00;
  int64_t iVar6;
  MCInst *in_RDX;
  MCInst *in_RDI;
  MCOperand *op;
  uint opcode;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SStream *in_stack_ffffffffffffffd0;
  SStream *O_00;
  
  OpNo = MCInst_getOpcode(in_RDI);
  if ((((OpNo == 0x2b) || (OpNo - 0x2d < 2)) || (OpNo == 0x32)) &&
     (uVar2 = MCInst_getNumOperands(in_RDI), uVar2 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isImm(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,2);
          iVar6 = MCOperand_getImm(pMVar5);
          if (iVar6 < 0) {
            MCInst_setOpcodePub(in_RDI,0x7c);
            op_00 = (SStream *)MCInst_getOperand(in_RDI,2);
            O_00 = op_00;
            iVar6 = MCOperand_getImm((MCOperand *)op_00);
            MCOperand_setImm((MCOperand *)op_00,-iVar6);
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,O_00);
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,O_00);
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,O_00);
            return true;
          }
        }
      }
    }
  }
  if (((((OpNo == 0x29) || (OpNo - 0x2d < 2)) ||
       ((OpNo == 0x32 || ((OpNo == 0xa5 || (OpNo == 0xa7)))))) || (OpNo == 0xa9)) &&
     (uVar2 = MCInst_getNumOperands(in_RDI), uVar2 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isImm(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,2);
          iVar6 = MCOperand_getImm(pMVar5);
          if (iVar6 == 0) {
            MCInst_setOpcodePub(in_RDI,0x8c);
            in_RDI->size = in_RDI->size + 0xff;
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,in_stack_ffffffffffffffd0);
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,in_stack_ffffffffffffffd0);
            return true;
          }
        }
      }
    }
  }
  if ((((OpNo == 0x110) || (OpNo == 0x112)) || (OpNo == 0x114)) &&
     (uVar2 = MCInst_getNumOperands(in_RDI), uVar2 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isImm(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,2);
          iVar6 = MCOperand_getImm(pMVar5);
          if (iVar6 == -1) {
            MCInst_setOpcodePub(in_RDI,0x8e);
            in_RDI->size = in_RDI->size + 0xff;
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,in_stack_ffffffffffffffd0);
            SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,OpNo,in_stack_ffffffffffffffd0);
            return true;
          }
        }
      }
    }
  }
  if ((OpNo == 0xa0 || OpNo == 0xa1) && (uVar2 = MCInst_getNumOperands(in_RDI), uVar2 == 2)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isImm(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,1);
        iVar6 = MCOperand_getImm(pMVar5);
        if (iVar6 == 0) {
          MCInst_setOpcodePub(in_RDI,0x90);
          in_RDI->size = in_RDI->size + 0xff;
          SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          printOperand(in_RDX,OpNo,in_stack_ffffffffffffffd0);
          return true;
        }
      }
    }
  }
  uVar2 = OpNo;
  if (((OpNo == 0x104) || (OpNo == 0x109)) && (uVar3 = MCInst_getNumOperands(in_RDI), uVar3 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,1);
          in_stack_ffffffffffffffb0 = MCOperand_getReg(pMVar5);
          pMVar5 = MCInst_getOperand(in_RDI,2);
          uVar3 = MCOperand_getReg(pMVar5);
          if (in_stack_ffffffffffffffb0 == uVar3) {
            MCInst_setOpcodePub(in_RDI,0x90);
            in_RDI->size = in_RDI->size + 0xfe;
            SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,uVar2,in_stack_ffffffffffffffd0);
            return true;
          }
        }
      }
    }
  }
  uVar3 = uVar2;
  if (((uVar2 - 0x102 < 2) || (uVar2 == 0x108)) &&
     (uVar4 = MCInst_getNumOperands(in_RDI), uVar4 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isImm(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,2);
          iVar6 = MCOperand_getImm(pMVar5);
          if (iVar6 == 0) {
            MCInst_setOpcodePub(in_RDI,0x8d);
            in_RDI->size = in_RDI->size + 0xff;
            SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,uVar3,in_stack_ffffffffffffffd0);
            SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,uVar3,in_stack_ffffffffffffffd0);
            return true;
          }
        }
      }
    }
  }
  if ((uVar3 == 0xb3 || uVar3 == 0xb4) && (uVar4 = MCInst_getNumOperands(in_RDI), uVar4 == 3)) {
    pMVar5 = MCInst_getOperand(in_RDI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (_Var1) {
      pMVar5 = MCInst_getOperand(in_RDI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,2);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(in_RDI,1);
          in_stack_ffffffffffffffa8 = MCOperand_getReg(pMVar5);
          pMVar5 = MCInst_getOperand(in_RDI,2);
          uVar4 = MCOperand_getReg(pMVar5);
          if (in_stack_ffffffffffffffa8 == uVar4) {
            MCInst_setOpcodePub(in_RDI,0x8f);
            in_RDI->size = in_RDI->size + 0xff;
            SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,uVar3,in_stack_ffffffffffffffd0);
            SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
            printOperand(in_RDX,uVar3,in_stack_ffffffffffffffd0);
            return true;
          }
        }
      }
    }
  }
  if (uVar3 == 0xa2) {
    uVar3 = MCInst_getNumOperands(in_RDI);
    if (uVar3 == 1) {
      pMVar5 = MCInst_getOperand(in_RDI,0);
      _Var1 = MCOperand_isImm(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,0);
        uVar3 = MCOperand_getReg(pMVar5);
        if (uVar3 == 0x10) {
          MCInst_setOpcodePub(in_RDI,0x8b);
          in_RDI->size = in_RDI->size + 0xff;
          SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                          (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
          return true;
        }
      }
    }
    uVar3 = MCInst_getNumOperands(in_RDI);
    if (uVar3 == 1) {
      pMVar5 = MCInst_getOperand(in_RDI,0);
      _Var1 = MCOperand_isImm(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(in_RDI,0);
        uVar3 = MCOperand_getReg(pMVar5);
        if (uVar3 == 1) {
          in_RDI->size = in_RDI->size + 0xff;
          SStream_concat0((SStream *)CONCAT44(OpNo,in_stack_ffffffffffffffb0),
                          (char *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool printAliasInstruction(MCInst *MI, SStream *O, MCRegisterInfo *MRI)
{
	unsigned opcode = MCInst_getOpcode(MI);
	MCOperand *op;

	switch(opcode) {
		/* ADD.Dx -i, x, y -> SUB.Dx x, i, y */
		case TMS320C64x_ADD_d2_rir:
		/* ADD.L -i, x, y -> SUB.L x, i, y */
		case TMS320C64x_ADD_l1_irr:
		case TMS320C64x_ADD_l1_ipp:
		/* ADD.S -i, x, y -> SUB.S x, i, y */
		case TMS320C64x_ADD_s1_irr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getImm(MCInst_getOperand(MI, 2)) < 0)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_SUB);
				op = MCInst_getOperand(MI, 2);
				MCOperand_setImm(op, -MCOperand_getImm(op));

				SStream_concat0(O, "SUB\t");
				printOperand(MI, 1, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 2, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* ADD.D 0, x, y -> MV.D x, y */
		case TMS320C64x_ADD_d1_rir:
		/* OR.D x, 0, y -> MV.D x, y */
		case TMS320C64x_OR_d2_rir:
		/* ADD.L 0, x, y -> MV.L x, y */
		case TMS320C64x_ADD_l1_irr:
		case TMS320C64x_ADD_l1_ipp:
		/* OR.L 0, x, y -> MV.L x, y */
		case TMS320C64x_OR_l1_irr:
		/* ADD.S 0, x, y -> MV.S x, y */
		case TMS320C64x_ADD_s1_irr:
		/* OR.S 0, x, y -> MV.S x, y */
		case TMS320C64x_OR_s1_irr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getImm(MCInst_getOperand(MI, 2)) == 0)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_MV);
				MI->size--;

				SStream_concat0(O, "MV\t");
				printOperand(MI, 1, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* XOR.D -1, x, y -> NOT.D x, y */
		case TMS320C64x_XOR_d2_rir:
		/* XOR.L -1, x, y -> NOT.L x, y */
		case TMS320C64x_XOR_l1_irr:
		/* XOR.S -1, x, y -> NOT.S x, y */
		case TMS320C64x_XOR_s1_irr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getImm(MCInst_getOperand(MI, 2)) == -1)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_NOT);
				MI->size--;

				SStream_concat0(O, "NOT\t");
				printOperand(MI, 1, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* MVK.D 0, x -> ZERO.D x */
		case TMS320C64x_MVK_d1_rr:
		/* MVK.L 0, x -> ZERO.L x */
		case TMS320C64x_MVK_l2_ir:
			if ((MCInst_getNumOperands(MI) == 2) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isImm(MCInst_getOperand(MI, 1)) &&
				(MCOperand_getImm(MCInst_getOperand(MI, 1)) == 0)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_ZERO);
				MI->size--;

				SStream_concat0(O, "ZERO\t");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* SUB.L x, x, y -> ZERO.L y */
		case TMS320C64x_SUB_l1_rrp_x1:
		/* SUB.S x, x, y -> ZERO.S y */
		case TMS320C64x_SUB_s1_rrr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2)))) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_ZERO);
				MI->size -= 2;

				SStream_concat0(O, "ZERO\t");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* SUB.L 0, x, y -> NEG.L x, y */
		case TMS320C64x_SUB_l1_irr:
		case TMS320C64x_SUB_l1_ipp:
		/* SUB.S 0, x, y -> NEG.S x, y */
		case TMS320C64x_SUB_s1_irr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getImm(MCInst_getOperand(MI, 2)) == 0)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_NEG);
				MI->size--;

				SStream_concat0(O, "NEG\t");
				printOperand(MI, 1, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* PACKLH2.L x, x, y -> SWAP2.L x, y */
		case TMS320C64x_PACKLH2_l1_rrr_x2:
		/* PACKLH2.S x, x, y -> SWAP2.S x, y */
		case TMS320C64x_PACKLH2_s1_rrr:
			if ((MCInst_getNumOperands(MI) == 3) &&
				MCOperand_isReg(MCInst_getOperand(MI, 0)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
				MCOperand_isReg(MCInst_getOperand(MI, 2)) &&
				(MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2)))) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_SWAP2);
				MI->size--;

				SStream_concat0(O, "SWAP2\t");
				printOperand(MI, 1, O);
				SStream_concat0(O, ", ");
				printOperand(MI, 0, O);

				return true;
			}
			break;
	}
	switch(opcode) {
		/* NOP 16 -> IDLE */
		/* NOP 1 -> NOP */
		case TMS320C64x_NOP_n:
			if ((MCInst_getNumOperands(MI) == 1) &&
				MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
				(MCOperand_getReg(MCInst_getOperand(MI, 0)) == 16)) {

				MCInst_setOpcodePub(MI, TMS320C64X_INS_IDLE);
				MI->size--;

				SStream_concat0(O, "IDLE");

				return true;
			}
			if ((MCInst_getNumOperands(MI) == 1) &&
				MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
				(MCOperand_getReg(MCInst_getOperand(MI, 0)) == 1)) {

				MI->size--;

				SStream_concat0(O, "NOP");

				return true;
			}
			break;
	}

	return false;
}